

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraph::ReadProjectPresets
          (cmCMakePresetsGraph *this,string *sourceDir,bool allowNoFiles)

{
  bool bVar1;
  bool allowNoFiles_local;
  string *sourceDir_local;
  cmCMakePresetsGraph *this_local;
  
  std::__cxx11::string::operator=((string *)&this->SourceDir,(string *)sourceDir);
  ClearPresets(this);
  bVar1 = ReadProjectPresetsInternal(this,allowNoFiles);
  if (!bVar1) {
    ClearPresets(this);
  }
  return bVar1;
}

Assistant:

bool cmCMakePresetsGraph::ReadProjectPresets(const std::string& sourceDir,
                                             bool allowNoFiles)
{
  this->SourceDir = sourceDir;
  this->ClearPresets();

  if (!this->ReadProjectPresetsInternal(allowNoFiles)) {
    this->ClearPresets();
    return false;
  }

  return true;
}